

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O0

void icu_63::anon_unknown_16::appendSubtag
               (CharString *s,char letter,char *subtag,int32_t length,UErrorCode *errorCode)

{
  UBool UVar1;
  char c;
  int local_34;
  int32_t i;
  UErrorCode *errorCode_local;
  int32_t length_local;
  char *subtag_local;
  char letter_local;
  CharString *s_local;
  
  UVar1 = ::U_FAILURE(*errorCode);
  if ((UVar1 == '\0') && (length != 0)) {
    UVar1 = CharString::isEmpty(s);
    if (UVar1 == '\0') {
      CharString::append(s,'_',errorCode);
    }
    CharString::append(s,letter,errorCode);
    for (local_34 = 0; local_34 < length; local_34 = local_34 + 1) {
      c = uprv_toupper_63(subtag[local_34]);
      CharString::append(s,c,errorCode);
    }
  }
  return;
}

Assistant:

void appendSubtag(CharString &s, char letter, const char *subtag, int32_t length,
                  UErrorCode &errorCode) {
    if(U_FAILURE(errorCode) || length == 0) { return; }
    if(!s.isEmpty()) {
        s.append('_', errorCode);
    }
    s.append(letter, errorCode);
    for(int32_t i = 0; i < length; ++i) {
        s.append(uprv_toupper(subtag[i]), errorCode);
    }
}